

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::iterate(StorageMultisampleTest *this)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  int iVar19;
  ContextType ctxType;
  int iVar20;
  int iVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  
  iVar19 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar2 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar1) || (bVar2)) {
    PrepareVertexArray(this);
    bVar1 = LoopTestOverS<signed_char,false,2u>(this,true);
    bVar2 = LoopTestOverS<signed_char,false,3u>(this,true);
    bVar3 = LoopTestOverS<unsigned_char,false,2u>(this,true);
    bVar4 = LoopTestOverS<unsigned_char,false,3u>(this,true);
    bVar5 = LoopTestOverS<short,false,2u>(this,true);
    bVar6 = LoopTestOverS<short,false,3u>(this,true);
    bVar7 = LoopTestOverS<unsigned_short,false,2u>(this,true);
    bVar8 = LoopTestOverS<unsigned_short,false,3u>(this,true);
    bVar9 = LoopTestOverS<int,false,2u>(this,false);
    bVar10 = LoopTestOverS<int,false,3u>(this,false);
    bVar11 = LoopTestOverS<unsigned_int,false,2u>(this,false);
    bVar12 = LoopTestOverS<unsigned_int,false,3u>(this,false);
    bVar13 = LoopTestOverS<unsigned_char,true,2u>(this,true);
    bVar14 = LoopTestOverS<unsigned_char,true,3u>(this,true);
    bVar15 = LoopTestOverS<unsigned_short,true,2u>(this,true);
    bVar16 = LoopTestOverS<unsigned_short,true,3u>(this,true);
    bVar17 = LoopTestOverS<float,true,2u>(this,false);
    bVar18 = LoopTestOverS<float,true,3u>(this,false);
    iVar20 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    if (this->m_to != 0) {
      (**(code **)(CONCAT44(extraout_var_00,iVar20) + 0x480))(1);
      this->m_to = 0;
    }
    iVar20 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    if (this->m_to_aux != 0) {
      (**(code **)(CONCAT44(extraout_var_01,iVar20) + 0x480))(1);
      this->m_to_aux = 0;
    }
    CleanFramebuffers(this);
    CleanPrograms(this);
    iVar20 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    do {
      iVar21 = (**(code **)(CONCAT44(extraout_var_02,iVar20) + 0x800))();
    } while (iVar21 != 0);
    CleanVertexArray(this);
    (**(code **)(CONCAT44(extraout_var,iVar19) + 0x4e8))(0x809d);
    do {
      iVar20 = (**(code **)(CONCAT44(extraout_var,iVar19) + 0x800))();
    } while (iVar20 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (((bVar17 && bVar18) && (bVar15 && bVar16)) &&
        (((bVar13 && bVar14) && ((bVar11 && bVar12) && (bVar9 && bVar10))) &&
        (((bVar7 && bVar8) && (bVar5 && bVar6)) && ((bVar3 && bVar4) && (bVar1 && bVar2))))) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StorageMultisampleTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	try
	{
		PrepareVertexArray();

		//  gl.enable(GL_MULTISAMPLE);

		is_ok &= LoopTestOverDOverS<glw::GLbyte, false>(true);
		is_ok &= LoopTestOverDOverS<glw::GLubyte, false>(true);
		is_ok &= LoopTestOverDOverS<glw::GLshort, false>(true);
		is_ok &= LoopTestOverDOverS<glw::GLushort, false>(true);
		is_ok &= LoopTestOverDOverS<glw::GLint, false>(false);
		is_ok &= LoopTestOverDOverS<glw::GLuint, false>(false);
		is_ok &= LoopTestOverDOverS<glw::GLubyte, true>(true);
		is_ok &= LoopTestOverDOverS<glw::GLushort, true>(true);
		is_ok &= LoopTestOverDOverS<glw::GLfloat, true>(false);
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	CleanInputTexture();
	CleanAuxiliaryTexture();
	CleanFramebuffers();
	CleanPrograms();
	CleanErrors();
	CleanVertexArray();
	gl.disable(GL_MULTISAMPLE);

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}